

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::DeleteComponent(ON_ComponentManifest *this,ON_UUID manifest_item_id)

{
  ON_ComponentManifestImpl *this_00;
  ON_ComponentManifestItem_PRIVATE *manifest_item_00;
  uchar auVar1 [8];
  uchar local_48 [8];
  ON_ComponentManifestItem_PRIVATE *manifest_item;
  ON_ComponentManifest *this_local;
  ON_UUID manifest_item_id_local;
  
  manifest_item_id_local._0_8_ = manifest_item_id.Data4;
  this_local = manifest_item_id._0_8_;
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    manifest_item_id_local.Data4 = (uchar  [8])&ON_ComponentManifestItem::UnsetItem;
  }
  else {
    this_00 = this->m_impl;
    manifest_item_00 =
         ON_ComponentManifestImpl::ItemFromManifestId(this->m_impl,(ON_UUID *)&this_local);
    local_48 = (uchar  [8])ON_ComponentManifestImpl::DeleteItem(this_00,manifest_item_00);
    if (local_48 == (uchar  [8])0x0) {
      local_48 = (uchar  [8])&ON_ComponentManifestItem::UnsetItem;
    }
    manifest_item_id_local.Data4[0] = local_48[0];
    manifest_item_id_local.Data4[1] = local_48[1];
    manifest_item_id_local.Data4[2] = local_48[2];
    manifest_item_id_local.Data4[3] = local_48[3];
    manifest_item_id_local.Data4[4] = local_48[4];
    manifest_item_id_local.Data4[5] = local_48[5];
    manifest_item_id_local.Data4[6] = local_48[6];
    manifest_item_id_local.Data4[7] = local_48[7];
  }
  auVar1[0] = manifest_item_id_local.Data4[0];
  auVar1[1] = manifest_item_id_local.Data4[1];
  auVar1[2] = manifest_item_id_local.Data4[2];
  auVar1[3] = manifest_item_id_local.Data4[3];
  auVar1[4] = manifest_item_id_local.Data4[4];
  auVar1[5] = manifest_item_id_local.Data4[5];
  auVar1[6] = manifest_item_id_local.Data4[6];
  auVar1[7] = manifest_item_id_local.Data4[7];
  return (ON_ComponentManifestItem *)auVar1;
}

Assistant:

const ON_ComponentManifestItem& ON_ComponentManifest::DeleteComponent(
  ON_UUID manifest_item_id
  )
{
  if (nullptr == m_impl)
    return ON_ComponentManifestItem::UnsetItem;

  const ON_ComponentManifestItem_PRIVATE* manifest_item = m_impl->DeleteItem(
    m_impl->ItemFromManifestId(manifest_item_id)
    );

  return (nullptr != manifest_item) ? *manifest_item : ON_ComponentManifestItem::UnsetItem;
}